

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

Image * GenImageGradientRadial
                  (Image *__return_storage_ptr__,int width,int height,float density,Color inner,
                  Color outer)

{
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  int iVar8;
  undefined1 auVar9 [14];
  unkuint10 Var10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [14];
  undefined1 auVar13 [12];
  undefined1 auVar14 [13];
  undefined1 auVar15 [11];
  undefined1 auVar16 [13];
  undefined1 auVar17 [11];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  uint6 uVar20;
  uint6 uVar21;
  void *pvVar22;
  ulong uVar23;
  void *pvVar24;
  ulong uVar25;
  short sVar26;
  float fVar27;
  ushort uVar33;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  float fVar34;
  ushort uVar37;
  undefined1 auVar35 [16];
  char cVar2;
  char cVar3;
  char cVar4;
  undefined1 auVar31 [16];
  undefined4 uVar28;
  undefined6 uVar29;
  undefined1 auVar36 [16];
  
  pvVar22 = malloc((long)(height * width) << 2);
  if (0 < height) {
    iVar8 = height;
    if (width < height) {
      iVar8 = width;
    }
    Var10 = CONCAT91((unkuint9)0 << 8,outer.a);
    auVar15[10] = 0;
    auVar15._0_10_ = Var10;
    auVar31[4] = outer.b;
    auVar31._0_4_ = outer;
    auVar31._5_11_ = auVar15 << 8;
    auVar14[0xc] = 0;
    auVar14._0_12_ = auVar31._4_12_;
    auVar9._1_13_ = auVar14 << 8;
    auVar9[0] = outer.g;
    auVar30._0_2_ = CONCAT11(0,outer.r);
    auVar30._2_14_ = auVar9;
    uVar33 = (ushort)Var10;
    auVar18._10_2_ = 0;
    auVar18._0_10_ = auVar30._0_10_;
    auVar18._12_2_ = uVar33;
    uVar20 = CONCAT42(auVar18._10_4_,auVar31._4_2_);
    auVar11._2_10_ = (unkuint10)uVar20 << 0x10;
    auVar11._0_2_ = auVar9._0_2_;
    Var10 = CONCAT91((unkuint9)0 << 8,inner.a);
    auVar17[10] = 0;
    auVar17._0_10_ = Var10;
    auVar36[4] = inner.b;
    auVar36._0_4_ = inner;
    auVar36._5_11_ = auVar17 << 8;
    auVar16[0xc] = 0;
    auVar16._0_12_ = auVar36._4_12_;
    auVar12._1_13_ = auVar16 << 8;
    auVar12[0] = inner.g;
    auVar35._0_2_ = CONCAT11(0,inner.r);
    auVar35._2_14_ = auVar12;
    uVar37 = (ushort)Var10;
    auVar19._10_2_ = 0;
    auVar19._0_10_ = auVar35._0_10_;
    auVar19._12_2_ = uVar37;
    uVar21 = CONCAT42(auVar19._10_4_,auVar36._4_2_);
    auVar13._2_10_ = (unkuint10)uVar21 << 0x10;
    auVar13._0_2_ = auVar12._0_2_;
    uVar23 = 0;
    pvVar24 = pvVar22;
    do {
      if (0 < width) {
        uVar25 = 0;
        do {
          fVar27 = hypotf((float)(int)uVar25 - (float)width * 0.5,
                          (float)(int)uVar23 - (float)height * 0.5);
          fVar27 = (fVar27 + -((float)iVar8 * 0.5) * density) /
                   ((1.0 - density) * (float)iVar8 * 0.5);
          if (fVar27 <= 0.0) {
            fVar27 = 0.0;
          }
          if (1.0 <= fVar27) {
            fVar27 = 1.0;
          }
          fVar34 = 1.0 - fVar27;
          auVar32._0_4_ = (int)(fVar27 * (float)auVar30._0_2_ + fVar34 * (float)auVar35._0_2_);
          auVar32._4_4_ = (int)(fVar27 * (float)auVar11._0_4_ + fVar34 * (float)auVar13._0_4_);
          auVar32._8_4_ = (int)(fVar27 * (float)(int)uVar20 + fVar34 * (float)(int)uVar21);
          auVar32._12_4_ = (int)(fVar27 * (float)uVar33 + fVar34 * (float)uVar37);
          auVar32 = auVar32 & _DAT_0015d900;
          sVar5 = auVar32._0_2_;
          cVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar32[0] - (0xff < sVar5);
          sVar5 = auVar32._2_2_;
          sVar26 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar32[2] - (0xff < sVar5),cVar1);
          sVar5 = auVar32._4_2_;
          cVar2 = (0 < sVar5) * (sVar5 < 0x100) * auVar32[4] - (0xff < sVar5);
          sVar5 = auVar32._6_2_;
          uVar28 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar32[6] - (0xff < sVar5),
                            CONCAT12(cVar2,sVar26));
          sVar5 = auVar32._8_2_;
          cVar3 = (0 < sVar5) * (sVar5 < 0x100) * auVar32[8] - (0xff < sVar5);
          sVar5 = auVar32._10_2_;
          uVar29 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar32[10] - (0xff < sVar5),
                            CONCAT14(cVar3,uVar28));
          sVar5 = auVar32._12_2_;
          cVar4 = (0 < sVar5) * (sVar5 < 0x100) * auVar32[0xc] - (0xff < sVar5);
          sVar7 = auVar32._14_2_;
          sVar5 = (short)((uint)uVar28 >> 0x10);
          sVar6 = (short)((uint6)uVar29 >> 0x20);
          sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar32[0xe] - (0xff < sVar7),
                                   CONCAT16(cVar4,uVar29)) >> 0x30);
          *(uint *)((long)pvVar24 + uVar25 * 4) =
               CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                        CONCAT12((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                 CONCAT11((0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5),
                                          (0 < sVar26) * (sVar26 < 0x100) * cVar1 - (0xff < sVar26))
                                ));
          uVar25 = uVar25 + 1;
        } while ((uint)width != uVar25);
      }
      uVar23 = uVar23 + 1;
      pvVar24 = (void *)((long)pvVar24 + (ulong)(uint)width * 4);
    } while (uVar23 != (uint)height);
  }
  __return_storage_ptr__->data = pvVar22;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageGradientRadial(int width, int height, float density, Color inner, Color outer)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));
    float radius = (width < height)? (float)width/2.0f : (float)height/2.0f;

    float centerX = (float)width/2.0f;
    float centerY = (float)height/2.0f;

    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            float dist = hypotf((float)x - centerX, (float)y - centerY);
            float factor = (dist - radius*density)/(radius*(1.0f - density));

            factor = (float)fmax(factor, 0.0f);
            factor = (float)fmin(factor, 1.f); // dist can be bigger than radius so we have to check

            pixels[y*width + x].r = (int)((float)outer.r*factor + (float)inner.r*(1.0f - factor));
            pixels[y*width + x].g = (int)((float)outer.g*factor + (float)inner.g*(1.0f - factor));
            pixels[y*width + x].b = (int)((float)outer.b*factor + (float)inner.b*(1.0f - factor));
            pixels[y*width + x].a = (int)((float)outer.a*factor + (float)inner.a*(1.0f - factor));
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}